

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmatrix.c
# Opt level: O1

Boolean Q_GetSymmetry(QMatrix *Q)

{
  LASErrIdType LVar1;
  Boolean BVar2;
  
  LVar1 = LASResult();
  BVar2 = False;
  if (LVar1 == LASOK) {
    BVar2 = Q->Symmetry;
  }
  return BVar2;
}

Assistant:

Boolean Q_GetSymmetry(QMatrix *Q)
/* returns True if Q is symmetric otherwise False */
{
    Boolean Symmetry;

    if (LASResult() == LASOK) {
        Symmetry = Q->Symmetry;
    } else {
        Symmetry = (Boolean)0;
    }
    return(Symmetry);
}